

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int lyxp_atomize(char *expr,lys_node *cur_snode,lyxp_node_type cur_snode_type,lyxp_set *set,
                int options)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  lyxp_expr *exp;
  lys_module *plVar3;
  uint uVar4;
  undefined8 local_38;
  uint16_t exp_idx;
  
  local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),options);
  local_38 = local_38 & 0xffffffffffff;
  exp = lyxp_parse_expr(expr);
  iVar2 = -1;
  if (exp != (lyxp_expr *)0x0) {
    iVar1 = reparse_expr(exp,(uint16_t *)((long)&local_38 + 6));
    if (iVar1 == 0) {
      if (local_38._6_2_ < exp->used) {
        uVar4 = (uint)local_38._6_2_;
        ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",
                exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar4 * 2)));
        iVar2 = -1;
        ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Unparsed characters \"%s\" left at the end of an XPath expression.",
                exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)(uVar4 * 2)));
      }
      else {
        print_expr_struct_debug(exp);
        local_38 = local_38 & 0xffffffffffff;
        *(undefined8 *)set = 0;
        *(undefined8 *)&set->field_0x8 = 0;
        set->used = 0;
        set->size = 0;
        set->ctx_pos = 0;
        set->ctx_size = 0;
        (set->val).nodes = (lyxp_set_nodes *)0x0;
        *(undefined8 *)((long)&set->val + 8) = 0;
        set->type = LYXP_SET_SNODE_SET;
        set_snode_insert_node(set,cur_snode,cur_snode_type);
        plVar3 = lys_node_module(cur_snode);
        iVar2 = eval_expr(exp,(uint16_t *)((long)&local_38 + 6),(lyd_node *)cur_snode,plVar3,set,
                          (int)local_38);
      }
    }
  }
  lyxp_expr_free(exp);
  return iVar2;
}

Assistant:

int
lyxp_atomize(const char *expr, const struct lys_node *cur_snode, enum lyxp_node_type cur_snode_type,
             struct lyxp_set *set, int options)
{
    struct lyxp_expr *exp;
    uint16_t exp_idx = 0;
    int rc = -1;

    exp = lyxp_parse_expr(expr);
    if (!exp) {
        rc = -1;
        goto finish;
    }

    rc = reparse_expr(exp, &exp_idx);
    if (rc) {
        goto finish;
    } else if (exp->used > exp_idx) {
        LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[exp_idx]]);
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Unparsed characters \"%s\" left at the end of an XPath expression.",
               &exp->expr[exp->expr_pos[exp_idx]]);
        rc = -1;
        goto finish;
    }

    print_expr_struct_debug(exp);

    exp_idx = 0;
    memset(set, 0, sizeof *set);
    set->type = LYXP_SET_SNODE_SET;
    set_snode_insert_node(set, cur_snode, cur_snode_type);

    rc = eval_expr(exp, &exp_idx, (struct lyd_node *)cur_snode, lys_node_module(cur_snode), set, options);

finish:
    lyxp_expr_free(exp);
    return rc;
}